

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::XMLDocument::MarkInUse(XMLDocument *this,XMLNode *node)

{
  int iVar1;
  XMLNode **ppXVar2;
  int local_1c;
  int i;
  XMLNode *node_local;
  XMLDocument *this_local;
  
  local_1c = 0;
  while( true ) {
    iVar1 = DynArray<tinyxml2::XMLNode_*,_10>::Size(&this->_unlinked);
    if (iVar1 <= local_1c) {
      return;
    }
    ppXVar2 = DynArray<tinyxml2::XMLNode_*,_10>::operator[](&this->_unlinked,local_1c);
    if (node == *ppXVar2) break;
    local_1c = local_1c + 1;
  }
  DynArray<tinyxml2::XMLNode_*,_10>::SwapRemove(&this->_unlinked,local_1c);
  return;
}

Assistant:

void XMLDocument::MarkInUse(XMLNode* node)
{
	TIXMLASSERT(node);
	TIXMLASSERT(node->_parent == 0);

	for (int i = 0; i < _unlinked.Size(); ++i) {
		if (node == _unlinked[i]) {
			_unlinked.SwapRemove(i);
			break;
		}
	}
}